

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

iterator __thiscall QJsonObject::findImpl<QStringView>(QJsonObject *this,QStringView key)

{
  long lVar1;
  bool bVar2;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_RSI;
  bool *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QStringView in_stack_00000020;
  qsizetype index;
  bool keyExists;
  QJsonObject *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::QExplicitlySharedDataPointer::operator_cast_to_bool
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x494da9);
  if (bVar2) {
    indexOf<QStringView>(in_RSI,in_stack_00000020,in_RDI);
  }
  iVar3 = end(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QJsonValueRef)(QJsonValueRef)iVar3;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::iterator QJsonObject::findImpl(T key)
{
    bool keyExists = false;
    auto index = o ? indexOf(o, key, &keyExists) : 0;
    if (!keyExists)
        return end();
    detach();
    return {this, index / 2};
}